

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall
embree::ImageT<embree::Col4<unsigned_char>_>::ImageT
          (ImageT<embree::Col4<unsigned_char>_> *this,size_t width,size_t height,
          Col4<unsigned_char> *color,bool copy,string *name,bool flip_y)

{
  pointer pcVar1;
  Col4<unsigned_char> *pCVar2;
  long lVar3;
  Col4<unsigned_char> *pCVar4;
  size_t sVar5;
  undefined7 in_register_00000081;
  size_t sVar6;
  ulong uVar7;
  
  (this->super_Image).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Image_002cdc08;
  (this->super_Image).width = width;
  (this->super_Image).height = height;
  (this->super_Image).name._M_dataplus._M_p = (pointer)&(this->super_Image).name.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Image).name,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002cdb98;
  if ((int)CONCAT71(in_register_00000081,copy) == 0) {
    this->data = color;
  }
  else {
    uVar7 = height * width;
    pCVar2 = (Col4<unsigned_char> *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | uVar7 * 4);
    this->data = pCVar2;
    if (flip_y) {
      if (height != 0) {
        pCVar4 = color + (height - 1) * width;
        sVar5 = 0;
        do {
          if (width != 0) {
            sVar6 = 0;
            do {
              pCVar2[sVar6] = pCVar4[sVar6];
              sVar6 = sVar6 + 1;
            } while (width != sVar6);
          }
          sVar5 = sVar5 + 1;
          pCVar2 = pCVar2 + width;
          pCVar4 = pCVar4 + -width;
        } while (sVar5 != height);
      }
    }
    else if (uVar7 != 0) {
      lVar3 = 0;
      do {
        pCVar2 = this->data;
        pCVar2[lVar3].r = color[lVar3].r;
        pCVar2[lVar3].g = color[lVar3].g;
        pCVar2[lVar3].b = color[lVar3].b;
        pCVar2[lVar3].a = color[lVar3].a;
        lVar3 = lVar3 + 1;
      } while (uVar7 - lVar3 != 0);
    }
  }
  return;
}

Assistant:

ImageT (size_t width, size_t height, T* color, const bool copy = true, const std::string& name = "", const bool flip_y = false)
      : Image(width,height,name)
    {
      if (copy)
      {
        data = new T[width*height];

        if (flip_y)
        {
          const T* in = color + (height-1) * width;
          T* out = data;

          for (size_t y=0; y<height; y++)
          {
            for (size_t x=0; x<width; x++)
              out[x] = in[x];

            in -= width;
            out += width;
          }
        }
        else
        {
          for (size_t i=0; i<width*height; i++)
            data[i] = color[i];
        }
      } 
      else
      {
        data = color;
      }
    }